

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

char * big2_skipS(ENCODING *enc,char *ptr)

{
  uint local_1c;
  char *local_18;
  char *ptr_local;
  ENCODING *enc_local;
  
  local_18 = ptr;
  while( true ) {
    if (*local_18 == '\0') {
      local_1c = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)local_18[1]);
    }
    else {
      local_1c = unicode_byte_type(*local_18,local_18[1]);
    }
    if ((1 < local_1c - 9) && (local_1c != 0x15)) break;
    local_18 = local_18 + 2;
  }
  return local_18;
}

Assistant:

static
const char *PREFIX(skipS)(const ENCODING *enc, const char *ptr)
{
  for (;;) {
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_LF:
    case BT_CR:
    case BT_S:
      ptr += MINBPC(enc);
      break;
    default:
      return ptr;
    }
  }
}